

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CaseGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseGenerateSyntax,slang::syntax::CaseGenerateSyntax_const&>
          (BumpAllocator *this,CaseGenerateSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  ExpressionSyntax *pEVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  TokenKind TVar10;
  undefined1 uVar11;
  NumericTokenFlags NVar12;
  uint32_t uVar13;
  TokenKind TVar14;
  undefined1 uVar15;
  NumericTokenFlags NVar16;
  uint32_t uVar17;
  CaseGenerateSyntax *pCVar18;
  
  pCVar18 = (CaseGenerateSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CaseGenerateSyntax *)this->endPtr < pCVar18 + 1) {
    pCVar18 = (CaseGenerateSyntax *)allocateSlow(this,0xd0,8);
  }
  else {
    this->head->current = (byte *)(pCVar18 + 1);
  }
  (pCVar18->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pCVar18->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pCVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar18->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar18->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e5c48;
  uVar7 = (args->keyword).field_0x2;
  NVar8.raw = (args->keyword).numFlags.raw;
  uVar9 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  TVar10 = (args->openParen).kind;
  uVar11 = (args->openParen).field_0x2;
  NVar12.raw = (args->openParen).numFlags.raw;
  uVar13 = (args->openParen).rawLen;
  pIVar4 = (args->openParen).info;
  pEVar5 = (args->condition).ptr;
  TVar14 = (args->closeParen).kind;
  uVar15 = (args->closeParen).field_0x2;
  NVar16.raw = (args->closeParen).numFlags.raw;
  uVar17 = (args->closeParen).rawLen;
  (pCVar18->keyword).kind = (args->keyword).kind;
  (pCVar18->keyword).field_0x2 = uVar7;
  (pCVar18->keyword).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->keyword).rawLen = uVar9;
  (pCVar18->keyword).info = pIVar3;
  (pCVar18->openParen).kind = TVar10;
  (pCVar18->openParen).field_0x2 = uVar11;
  (pCVar18->openParen).numFlags = (NumericTokenFlags)NVar12.raw;
  (pCVar18->openParen).rawLen = uVar13;
  (pCVar18->openParen).info = pIVar4;
  (pCVar18->condition).ptr = pEVar5;
  (pCVar18->closeParen).kind = TVar14;
  (pCVar18->closeParen).field_0x2 = uVar15;
  (pCVar18->closeParen).numFlags = (NumericTokenFlags)NVar16.raw;
  (pCVar18->closeParen).rawLen = uVar17;
  (pCVar18->closeParen).info = (args->closeParen).info;
  uVar6 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar18->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pCVar18->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pCVar18->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e5cf8;
  (pCVar18->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  sVar2 = (args->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pCVar18->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_ptr;
  (pCVar18->items).super_span<slang::syntax::CaseItemSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pCVar18->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e60e0;
  uVar7 = (args->endCase).field_0x2;
  NVar8.raw = (args->endCase).numFlags.raw;
  uVar9 = (args->endCase).rawLen;
  pIVar3 = (args->endCase).info;
  (pCVar18->endCase).kind = (args->endCase).kind;
  (pCVar18->endCase).field_0x2 = uVar7;
  (pCVar18->endCase).numFlags = (NumericTokenFlags)NVar8.raw;
  (pCVar18->endCase).rawLen = uVar9;
  (pCVar18->endCase).info = pIVar3;
  return pCVar18;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }